

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::
InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>
  *pvVar1;
  variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>
  *entry;
  variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>
  *__variants;
  int local_5c;
  int local_58;
  int local_54;
  anon_class_32_4_f17ee1e6 local_50;
  
  record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
            ((InterpolationBase *)this,it,MAT,MF,MT);
  pvVar1 = *(variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>
             **)(this + 0x68);
  for (__variants = *(variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>
                      **)(this + 0x60); __variants != pvVar1; __variants = __variants + 1) {
    local_50.MAT = &local_54;
    local_50.MF = &local_58;
    local_50.MT = &local_5c;
    local_5c = MT;
    local_58 = MF;
    local_54 = MAT;
    local_50.it = it;
    std::
    visit<njoy::ENDFtk::print<std::back_insert_iterator<std::__cxx11::string>,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>(std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>const&,std::back_insert_iterator<std::__cxx11::string>&,int,int,int)::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>const&>
              (&local_50,__variants);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  this->interpolation_.print( it, MAT, MF, MT );
  for ( const auto& entry : this->sequence_ ) {

    ENDFtk::print( entry, it, MAT, MF, MT );
  }
}